

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O3

string * __thiscall
enact::AstSerialise::visitFunctionStmt_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,FunctionStmt *stmt)

{
  string *psVar1;
  pointer pPVar2;
  BlockExpr *pBVar3;
  FunctionStmt *pFVar4;
  AstSerialise *pAVar5;
  string *psVar6;
  int iVar7;
  ostream *poVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Param *param;
  pointer pPVar9;
  string separator;
  stringstream s;
  char *local_210;
  char *local_208;
  char local_200;
  undefined7 uStack_1ff;
  char local_1f0;
  undefined7 uStack_1ef;
  long local_1e8;
  long local_1e0 [2];
  FunctionStmt *local_1d0;
  AstSerialise *local_1c8;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8 = this;
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(Stmt::Function ",0x10);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(stmt->name).lexeme._M_dataplus._M_p,
                      (stmt->name).lexeme._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," (",2);
  local_210 = &local_200;
  local_208 = (char *)0x0;
  local_200 = '\0';
  pPVar9 = (stmt->params).
           super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (stmt->params).
           super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1d0 = stmt;
  if (pPVar9 != pPVar2) {
    do {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_210,(long)local_208);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(pPVar9->name).lexeme._M_dataplus._M_p,
                          (pPVar9->name).lexeme._M_string_length);
      local_1f0 = ' ';
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_1f0,1);
      iVar7 = (*((pPVar9->typename_)._M_t.
                 super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
                 .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->
                _vptr_Typename[4])();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,*(char **)CONCAT44(extraout_var,iVar7),
                 ((undefined8 *)CONCAT44(extraout_var,iVar7))[1]);
      std::__cxx11::string::_M_replace((ulong)&local_210,0,local_208,0x11c064);
      pPVar9 = pPVar9 + 1;
    } while (pPVar9 != pPVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,") ",2);
  psVar6 = local_1c0;
  pAVar5 = local_1c8;
  pFVar4 = local_1d0;
  iVar7 = (*((local_1d0->returnTypename)._M_t.
             super___uniq_ptr_impl<const_enact::Typename,_std::default_delete<const_enact::Typename>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_enact::Typename_*,_std::default_delete<const_enact::Typename>_>
             .super__Head_base<0UL,_const_enact::Typename_*,_false>._M_head_impl)->_vptr_Typename[4]
          )();
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,*(char **)CONCAT44(extraout_var_00,iVar7),
                      ((undefined8 *)CONCAT44(extraout_var_00,iVar7))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," (\n",3);
  psVar1 = &pAVar5->m_ident;
  std::__cxx11::string::append((char *)psVar1);
  pBVar3 = (pFVar4->body)._M_t.
           super___uniq_ptr_impl<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>._M_t.
           super__Tuple_impl<0UL,_enact::BlockExpr_*,_std::default_delete<enact::BlockExpr>_>.
           super__Head_base<0UL,_enact::BlockExpr_*,_false>._M_head_impl;
  (*(pBVar3->super_Expr)._vptr_Expr[2])(&local_1f0,pBVar3,&pAVar5->field_0x8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)CONCAT71(uStack_1ef,local_1f0),local_1e8);
  if ((long *)CONCAT71(uStack_1ef,local_1f0) != local_1e0) {
    operator_delete((long *)CONCAT71(uStack_1ef,local_1f0),local_1e0[0] + 1);
  }
  std::__cxx11::string::erase((ulong)psVar1,0);
  local_1f0 = ')';
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_1f0,1);
  std::__cxx11::stringbuf::str();
  if (local_210 != &local_200) {
    operator_delete(local_210,CONCAT71(uStack_1ff,local_200) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar6;
}

Assistant:

std::string AstSerialise::visitFunctionStmt(FunctionStmt &stmt) {
        std::stringstream s;

        s << "(Stmt::Function " << stmt.name.lexeme << " (";

        std::string separator;
        for (auto &param : stmt.params) {
            s << separator << param.name.lexeme << ' ' << param.typename_->name();
            separator = " ";
        }

        s << ") " << stmt.returnTypename->name() << " (\n";
        m_ident += "    ";

        s << visitExpr(*stmt.body);

        m_ident.erase(0, 4);
        s << ')';

        return s.str();
    }